

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

bool nite::keyboardPressed(uint key)

{
  bool bVar1;
  byte bVar2;
  
  if (key < 0x65) {
    if (isKeysStatePressed[key] != false) {
      return true;
    }
    if (KeysStatePressed[key] == true) {
      bVar1 = false;
      if (KeysState[key] != false) {
        return false;
      }
    }
    else {
      if (KeysState[key] == false) goto LAB_0018726c;
      isKeysStatePressed[key] = true;
      bVar1 = true;
    }
    bVar2 = KeysStatePressed[key] ^ 1;
    KeysStatePressed[key] = bVar1;
  }
  else {
LAB_0018726c:
    bVar2 = 0;
  }
  return (bool)bVar2;
}

Assistant:

bool nite::keyboardPressed(unsigned key){
	if (key >= niteKeysn){
		return 0;
	}

	if (isKeysStatePressed[key]){
		return 1;
	}

	if (KeysStatePressed[key] and KeysState[key]){
		return 0;
	}

	if (KeysStatePressed[key]){
		KeysStatePressed[key] = 0;
		return 0;
	}

	if (!KeysStatePressed[key] and KeysState[key]){
		isKeysStatePressed[key] = 1;
		KeysStatePressed[key] = 1;
		return 1;
	}

	return 0;
}